

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

Matrix<float,_4,_4,_0,_4,_4> *
getGTTransformations<float>(Matrix<float,_4,_4,_0,_4,_4> *__return_storage_ptr__,bool verbose)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  ostream *poVar5;
  undefined7 in_register_00000031;
  Matrix<float,_3,_1,_0,_3,_1> tranGT;
  Type local_108;
  Matrix<float,_3,_3,_0,_3,_3> rotGT;
  AngleAxis<float> local_a8;
  Eigen local_98 [24];
  AngleAxis<float> local_80;
  PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> local_70 [12];
  float local_64;
  AngleAxis<float> local_60;
  DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_50 [32];
  
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity
            ((IdentityReturnType *)&local_108,4,4);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,4,4,0,4,4>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
            (__return_storage_ptr__,(IdentityReturnType *)&local_108);
  iVar4 = rand();
  fVar1 = (float)(iVar4 % 200) / 5.0;
  iVar4 = rand();
  fVar2 = (float)(iVar4 % 200) / 5.0;
  iVar4 = rand();
  fVar3 = (float)(iVar4 % 200) / 5.0;
  if ((int)CONCAT71(in_register_00000031,verbose) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Rand() angles = (");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,fVar1);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,fVar2);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,fVar3);
    poVar5 = std::operator<<(poVar5,")");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::UnitZ();
  Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,3,3,0,3,3>>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&local_60,
             (DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
              *)&local_108);
  local_60.m_angle = (fVar3 * 3.1415927) / 360.0;
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::UnitY();
  Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,3,3,0,3,3>>const,3,1,false>>
            (local_70,(DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
                       *)&tranGT);
  local_64 = (fVar2 * 3.1415927) / 360.0;
  Eigen::AngleAxis<float>::operator*(&local_a8,&local_60);
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::UnitX();
  Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,3,3,0,3,3>>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&local_80,local_50);
  local_80.m_angle = (fVar1 * 3.1415927) / 360.0;
  Eigen::operator*(local_98,(QuaternionType *)&local_a8,&local_80);
  Eigen::Matrix<float,3,3,0,3,3>::operator=
            ((Matrix<float,3,3,0,3,3> *)&rotGT,
             (RotationBase<Eigen::Quaternion<float,_0>,_3> *)local_98);
  if (verbose) {
    poVar5 = std::operator<<((ostream *)&std::cout,"GT Rotation Matrix: ");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&rotGT);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  iVar4 = rand();
  tranGT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (float)(iVar4 % 200) / 10.0 + -10.0;
  iVar4 = rand();
  tranGT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (float)(iVar4 % 200) / 10.0 + -10.0;
  iVar4 = rand();
  tranGT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (float)(iVar4 % 200) / 10.0 + -10.0;
  if (verbose) {
    poVar5 = std::operator<<((ostream *)&std::cout,"GT Translation Vector: ");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    local_108.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
         (PointerType)&tranGT;
    poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                       *)&local_108);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_108,__return_storage_ptr__,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,3,0,3,3>>
            (&local_108,&rotGT);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_108,__return_storage_ptr__,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,1,0,3,1>>
            (&local_108,&tranGT);
  return __return_storage_ptr__;
}

Assistant:

Matrix<floatPrec, 4, 4> getGTTransformations(bool verbose)
{

  Matrix<floatPrec, 4, 4> transOut;

  // init the output
  transOut = Matrix<floatPrec, 4, 4>::Identity(4, 4);

  floatPrec angX, angY, angZ;
  Matrix<floatPrec, 3, 3> rotGT;
  Matrix<floatPrec, 3, 1> tranGT;

  // generate random angles
  angX = (rand() % 200) / 5.0;
  angY = (rand() % 200) / 5.0;
  angZ = (rand() % 200) / 5.0;
  if (verbose)
    cout << "Rand() angles = (" << angX << "," << angY << "," << angZ << ")" << endl;

  // create a rotation matrix
  rotGT = AngleAxis<floatPrec>(angZ * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitZ()) *
          AngleAxis<floatPrec>(angY * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitY()) *
          AngleAxis<floatPrec>(angX * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitX());
  if (verbose)
    cout << "GT Rotation Matrix: " << endl
         << rotGT << endl;
  // cout << rotGT.transpose()*rotGT << endl;

  // create a translation vector
  tranGT(0) = rand() % 200 / 10.0 - 10.0;
  tranGT(1) = rand() % 200 / 10.0 - 10.0;
  tranGT(2) = rand() % 200 / 10.0 - 10.0;
  if (verbose)
    cout << "GT Translation Vector: " << endl
         << tranGT.transpose() << endl;

  transOut.topLeftCorner(3, 3) = rotGT;
  transOut.topRightCorner(3, 1) = tranGT;

  return transOut;
}